

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_MergeNodeConforming(leb_Heap *leb,leb_Node node,leb_DiamondParent diamond)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  leb_Node node_00;
  
  if (leb->minDepth != node.depth) {
    node_00 = leb__RightChildNode(diamond.top);
    bVar1 = leb_IsLeafNode(leb,(leb_Node)((ulong)node ^ 1));
    bVar2 = leb_IsLeafNode(leb,node_00);
    bVar3 = leb_IsLeafNode(leb,(leb_Node)((ulong)(node_00.id != node_00.depth) ^ (ulong)node_00));
    if (((bVar1) && (bVar2)) && (bVar3)) {
      leb__MergeNode(leb,node);
      leb__MergeNode(leb,node_00);
      return;
    }
  }
  return;
}

Assistant:

LEBDEF void
leb_MergeNodeConforming(
    leb_Heap *leb,
    const leb_Node node,
    const leb_DiamondParent diamond
) {
    if (!leb_IsRootNode(leb, node)) {
        leb_Node dualNode = leb__RightChildNode(diamond.top);
        bool b1 = leb_IsLeafNode(leb, leb__SiblingNode_Fast(node));
        bool b2 = leb_IsLeafNode(leb, dualNode);
        bool b3 = leb_IsLeafNode(leb, leb__SiblingNode(dualNode));

        if (b1 && b2 && b3) {
            leb__MergeNode(leb, node);
            leb__MergeNode(leb, dualNode);
        }
    }
}